

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarHeader
          (Scanner *this,char *ChompingIndicator,uint *IndentIndicator,bool *IsDone)

{
  iterator pcVar1;
  ilist_node_base<false> *piVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  ilist_node_base<false> *piVar6;
  char *pcVar7;
  char *pcVar8;
  list_type *plVar9;
  bool bVar10;
  Child local_68;
  undefined8 uStack_60;
  ilist_node_base<false> *piStack_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pcVar1 = this->Current;
  cVar3 = scanBlockChompingIndicator(this);
  *ChompingIndicator = cVar3;
  uVar5 = scanBlockIndentationIndicator(this);
  *IndentIndicator = uVar5;
  if (*ChompingIndicator == ' ') {
    cVar3 = scanBlockChompingIndicator(this);
    *ChompingIndicator = cVar3;
  }
  pcVar7 = this->Current;
  do {
    pcVar8 = pcVar7;
    if ((this->End != pcVar7) && ((*pcVar7 == ' ' || (*pcVar7 == '\t')))) {
      pcVar8 = pcVar7 + 1;
    }
    bVar10 = pcVar8 != pcVar7;
    pcVar7 = pcVar8;
  } while (bVar10);
  this->Current = pcVar8;
  skipComment(this);
  if (this->Current == this->End) {
    local_48 = 0;
    local_40 = 0;
    local_68.decUI = 0x13;
    piStack_58 = (ilist_node_base<false> *)(this->Current + -(long)pcVar1);
    uStack_60 = pcVar1;
    local_50 = &local_40;
    piVar6 = (ilist_node_base<false> *)
             BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                       (&(this->TokenQueue).
                         super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                        (Align)0x4);
    piVar6->Prev = (ilist_node_base<false> *)0x0;
    piVar6->Next = (ilist_node_base<false> *)0x0;
    *(uint *)&piVar6[1].Prev = local_68.decUI;
    *(undefined4 *)((long)&piVar6[1].Prev + 4) = local_68._4_4_;
    *(undefined4 *)&piVar6[1].Next = (undefined4)uStack_60;
    *(undefined4 *)((long)&piVar6[1].Next + 4) = uStack_60._4_4_;
    piVar6[2].Prev = piStack_58;
    piVar6[2].Next = (ilist_node_base<false> *)&piVar6[3].Next;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&piVar6[2].Next,local_50,local_50 + local_48);
    plVar9 = &(this->TokenQueue).List;
    piVar2 = (plVar9->Sentinel).
             super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
             .super_node_base_type.Prev;
    piVar6->Next = (ilist_node_base<false> *)plVar9;
    piVar6->Prev = piVar2;
    piVar2->Next = piVar6;
    (plVar9->Sentinel).
    super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
    .super_node_base_type.Prev = piVar6;
    *IsDone = true;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    bVar10 = true;
  }
  else {
    bVar4 = consumeLineBreakIfPresent(this);
    bVar10 = true;
    if (!bVar4) {
      Twine::Twine((Twine *)&local_68,"Expected a line break after block scalar header");
      setError(this,(Twine *)&local_68,this->Current);
      bVar10 = false;
    }
  }
  return bVar10;
}

Assistant:

bool Scanner::scanBlockScalarHeader(char &ChompingIndicator,
                                    unsigned &IndentIndicator, bool &IsDone) {
  auto Start = Current;

  ChompingIndicator = scanBlockChompingIndicator();
  IndentIndicator = scanBlockIndentationIndicator();
  // Check for the chomping indicator once again.
  if (ChompingIndicator == ' ')
    ChompingIndicator = scanBlockChompingIndicator();
  Current = skip_while(&Scanner::skip_s_white, Current);
  skipComment();

  if (Current == End) { // EOF, we have an empty scalar.
    Token T;
    T.Kind = Token::TK_BlockScalar;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    IsDone = true;
    return true;
  }

  if (!consumeLineBreakIfPresent()) {
    setError("Expected a line break after block scalar header", Current);
    return false;
  }
  return true;
}